

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dedma.c
# Opt level: O1

int dedma(state *s,FILE *f,_Bool dry_run)

{
  undefined3 uVar1;
  uint32_t uVar2;
  int iVar3;
  uint32_t _a;
  uint uVar4;
  code *pcVar5;
  ent *peVar6;
  ent *peVar7;
  ent *peVar8;
  uint uVar9;
  undefined7 in_register_00000011;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int i;
  bool bVar14;
  
  s->f = f;
  if ((int)CONCAT71(in_register_00000011,dry_run) == 0) {
    pcVar5 = printf;
  }
  else {
    pcVar5 = dont_printf;
  }
  (s->op).print = pcVar5;
  i = 0;
  peVar6 = get_ent(s,0);
  if (peVar6 != (ent *)0x0) {
    peVar8 = (ent *)0x0;
    do {
      peVar7 = peVar6;
      if (peVar8 != (ent *)0x0) {
        uVar9 = peVar7->addr;
        if ((uVar9 < (s->filter).addr0) || ((s->filter).addr1 <= uVar9)) {
          peVar7->out_of_band = true;
        }
        else {
          uVar12 = uVar9 - peVar8->addr;
          uVar4 = -uVar12;
          if (0 < (int)uVar12) {
            uVar4 = uVar12;
          }
          if ((uVar4 < 0x4001) || (peVar8->out_of_band != false)) {
            if (uVar9 < peVar8->addr + 4) {
              iVar11 = i;
              do {
                iVar3 = iVar11;
                if (iVar3 <= i + -0x3fff) goto LAB_001027e4;
                peVar6 = get_ent(s,iVar3 + -1);
                if (peVar6 == (ent *)0x0) goto LAB_001027e4;
                uVar9 = peVar7->addr;
                uVar4 = peVar6->addr;
                if (uVar9 == uVar4) {
                  uVar1 = *(undefined3 *)&peVar7->field_0x9;
                  peVar6->out_of_band = peVar7->out_of_band;
                  *(undefined3 *)&peVar6->field_0x9 = uVar1;
                  uVar2 = peVar7->val;
                  peVar6->addr = peVar7->addr;
                  peVar6->val = uVar2;
LAB_001028c1:
                  drop_ent(s,i);
                  i = i + -1;
                  goto LAB_001027e4;
                }
                if (uVar9 == uVar4 + 3) {
                  uVar9 = peVar7->val << 0x18;
LAB_001028be:
                  peVar6->val = peVar6->val | uVar9;
                  goto LAB_001028c1;
                }
                if (uVar9 == uVar4 + 2) {
                  uVar9 = peVar7->val << 0x10;
                  goto LAB_001028be;
                }
                if (uVar9 == uVar4 + 1) {
                  uVar9 = peVar7->val << 8;
                  goto LAB_001028be;
                }
                iVar11 = iVar3 + -1;
              } while (uVar9 <= uVar4);
              rotate_ent(s,iVar3,i);
            }
          }
          else {
            iVar11 = i + -1;
            iVar10 = 7;
            iVar3 = 1;
            do {
              iVar13 = iVar3;
              bVar14 = iVar10 == 0;
              iVar10 = iVar10 + -1;
              if ((bVar14) || (peVar6 = get_ent(s,iVar11 + 2), peVar6 == (ent *)0x0))
              goto LAB_001027e4;
              uVar4 = peVar7->addr - peVar6->addr;
              uVar9 = -uVar4;
              if (0 < (int)uVar4) {
                uVar9 = uVar4;
              }
              iVar11 = iVar11 + 1;
              iVar3 = iVar13 + 1;
            } while (uVar9 < 0x4001);
            if (i <= iVar11) {
              do {
                peVar8 = get_ent(s,i);
                peVar8->out_of_band = true;
                i = i + 1;
                iVar13 = iVar13 + -1;
              } while (iVar13 != 0);
            }
            uVar9 = peVar7->addr;
            if (uVar9 < peVar6->addr) {
              uVar4 = (s->filter).addr0;
              uVar12 = uVar9 + 4;
              if (uVar9 + 4 <= uVar4) {
                uVar12 = uVar4;
              }
              (s->filter).addr0 = uVar12;
            }
            else if (peVar6->addr < uVar9) {
              uVar4 = (s->filter).addr1;
              if (uVar9 < uVar4) {
                uVar4 = uVar9;
              }
              (s->filter).addr1 = uVar4;
            }
          }
        }
      }
LAB_001027e4:
      i = i + 1;
      peVar6 = get_ent(s,i);
      peVar8 = peVar7;
    } while (peVar6 != (ent *)0x0);
  }
  flush_cache(s);
  return 0;
}

Assistant:

int
dedma(struct state *s, FILE *f, bool dry_run)
{
	struct filter *flt = &s->filter;
	struct ent *e0 = NULL, *e1;
	int i, j; /* dump line numbers */

	s->f = f;
	s->op.print = (dry_run ? dont_printf : printf);

	for (i = 0; e1 = e0, e0 = get_ent(s, i); i++) {
		if (!e1)
			continue;

		if (e0->addr < flt->addr0 || e0->addr >= flt->addr1) {
			/* out of band data */
			e0->out_of_band = true;

		} else if (abs(e0->addr - e1->addr) > MAX_DELTA &&
			   !e1->out_of_band) {
			/* wrap around or out of band data not caught by
			 * the address window */

			for (j = i + 1; (j < i + MAX_OUT_OF_BAND &&
					 (e1 = get_ent(s, j))); j++) {
				if (abs(e0->addr - e1->addr) > MAX_DELTA) {
					for (; i < j; i++)
						get_ent(s, i)->out_of_band = true;

					/* shrink the address window */
					if (e1->addr > e0->addr)
						flt->addr0 = max(e0->addr + 4,
								 flt->addr0);
					else if (e1->addr < e0->addr)
						flt->addr1 = min(e0->addr,
								 flt->addr1);
					break;
				}
			}

		} else if (e0->addr < e1->addr + 4) {
			/* badly ordered write, find a place for it */

			for (j = i - 1; (j > i - MAX_DELTA &&
					 (e1 = get_ent(s, j))); j--) {
				if (e0->addr == e1->addr) {
					/* duplicated write, keep the
					 * most recent one */
					*e1 = *e0;
					drop_ent(s, i--);
					break;

				} else if (e0->addr == e1->addr + 3) {
					/* 8bit writes */
					e1->val |= e0->val << 24;
					drop_ent(s, i--);
					break;

				} else if (e0->addr == e1->addr + 2) {
					/* 16bit writes */
					e1->val |= e0->val << 16;
					drop_ent(s, i--);
					break;

				} else if (e0->addr == e1->addr + 1) {
					/* 8bit writes */
					e1->val |= e0->val << 8;
					drop_ent(s, i--);
					break;

				} else if (e0->addr > e1->addr) {
					/* unordered write */
					rotate_ent(s, j + 1, i);
					break;
				}
			}
		}
	}

	flush_cache(s);
	return 0;
}